

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMakeCurrentPerfTests.cpp
# Opt level: O2

void __thiscall deqp::egl::MakeCurrentPerfCase::createPBuffer(MakeCurrentPerfCase *this)

{
  int iVar1;
  deUint32 err;
  Library *pLVar2;
  undefined4 extraout_var;
  EGLSurface surface;
  EGLint attribList [5];
  value_type local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  pLVar2 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
  local_38 = 0x3057;
  uStack_34 = 0x100;
  uStack_30 = 0x3056;
  uStack_2c = 0x100;
  local_28 = 0x3038;
  iVar1 = (*pLVar2->_vptr_Library[10])(pLVar2,this->m_display,this->m_config);
  local_40 = (value_type)CONCAT44(extraout_var,iVar1);
  err = (*pLVar2->_vptr_Library[0x1f])(pLVar2);
  eglu::checkError(err,"eglCreatePbufferSurface()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglMakeCurrentPerfTests.cpp"
                   ,0x10b);
  std::vector<void_*,_std::allocator<void_*>_>::push_back(&this->m_surfaces,&local_40);
  return;
}

Assistant:

void MakeCurrentPerfCase::createPBuffer (void)
{
	const Library&	egl		= m_eglTestCtx.getLibrary();
	const EGLint	width	= 256;
	const EGLint	height	= 256;

	const EGLint attribList[] = {
		EGL_WIDTH,	width,
		EGL_HEIGHT, height,
		EGL_NONE
	};

	EGLSurface	surface = egl.createPbufferSurface(m_display, m_config, attribList);

	EGLU_CHECK_MSG(egl, "eglCreatePbufferSurface()");

	m_surfaces.push_back(surface);
}